

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

int c_vsnprintf(char *buf,size_t buf_size,char *fmt,__va_list_tag *ap)

{
  char cVar1;
  uint uVar2;
  char *__string;
  int64_t num_00;
  int iVar3;
  int iVar4;
  size_t sVar5;
  __va_list_tag *p_Var6;
  bool bVar7;
  int local_1bc;
  int64_t *local_1b0;
  int64_t *local_198;
  uint *local_170;
  int64_t *local_148;
  int64_t *local_120;
  int *local_f8;
  undefined4 *local_d0;
  int local_b8;
  undefined8 *local_a8;
  int *local_88;
  int *local_70;
  unsigned_long num;
  int pad;
  int j;
  char *s;
  int field_width;
  int precision;
  int flags;
  int len_mod;
  int i;
  int ch;
  __va_list_tag *ap_local;
  char *fmt_local;
  size_t buf_size_local;
  char *buf_local;
  
  flags = 0;
  ap_local = (__va_list_tag *)fmt;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                while( true ) {
                  while( true ) {
                    p_Var6 = (__va_list_tag *)((long)&ap_local->gp_offset + 1);
                    cVar1 = (char)ap_local->gp_offset;
                    local_1bc = (int)buf_size;
                    if (cVar1 == '\0') {
                      if (buf_size != 0) {
                        if (flags < local_1bc) {
                          local_1bc = flags;
                        }
                        else {
                          local_1bc = local_1bc + -1;
                        }
                        buf[local_1bc] = '\0';
                      }
                      return flags;
                    }
                    ap_local = p_Var6;
                    if (cVar1 == '%') break;
                    if (flags < local_1bc) {
                      buf[flags] = cVar1;
                    }
                    flags = flags + 1;
                  }
                  precision = 0;
                  s._4_4_ = 0;
                  s._0_4_ = 0;
                  field_width = (int)((char)p_Var6->gp_offset == '0');
                  while( true ) {
                    bVar7 = false;
                    if ('/' < (char)ap_local->gp_offset) {
                      bVar7 = (char)ap_local->gp_offset < ':';
                    }
                    if (!bVar7) break;
                    s._0_4_ = (char)ap_local->gp_offset + -0x30 + (int)s * 10;
                    ap_local = (__va_list_tag *)((long)&ap_local->gp_offset + 1);
                  }
                  if ((char)ap_local->gp_offset == '*') {
                    uVar2 = ap->gp_offset;
                    if (uVar2 < 0x29) {
                      local_70 = (int *)((long)(int)uVar2 + (long)ap->reg_save_area);
                      ap->gp_offset = uVar2 + 8;
                    }
                    else {
                      local_70 = (int *)ap->overflow_arg_area;
                      ap->overflow_arg_area = local_70 + 2;
                    }
                    s._0_4_ = *local_70;
                    ap_local = (__va_list_tag *)((long)&ap_local->gp_offset + 1);
                  }
                  if ((char)ap_local->gp_offset == '.') {
                    p_Var6 = (__va_list_tag *)((long)&ap_local->gp_offset + 1);
                    if ((char)p_Var6->gp_offset == '*') {
                      uVar2 = ap->gp_offset;
                      if (uVar2 < 0x29) {
                        local_88 = (int *)((long)(int)uVar2 + (long)ap->reg_save_area);
                        ap->gp_offset = uVar2 + 8;
                      }
                      else {
                        local_88 = (int *)ap->overflow_arg_area;
                        ap->overflow_arg_area = local_88 + 2;
                      }
                      s._4_4_ = *local_88;
                      ap_local = (__va_list_tag *)((long)&ap_local->gp_offset + 2);
                    }
                    else {
                      while( true ) {
                        ap_local = p_Var6;
                        bVar7 = false;
                        if ('/' < (char)ap_local->gp_offset) {
                          bVar7 = (char)ap_local->gp_offset < ':';
                        }
                        if (!bVar7) break;
                        s._4_4_ = (char)ap_local->gp_offset + -0x30 + s._4_4_ * 10;
                        p_Var6 = (__va_list_tag *)((long)&ap_local->gp_offset + 1);
                      }
                    }
                  }
                  cVar1 = (char)ap_local->gp_offset;
                  if ((((cVar1 == 'I') || (cVar1 == 'L')) || (cVar1 == 'h')) ||
                     (((cVar1 == 'j' || (cVar1 == 'l')) ||
                      ((cVar1 == 'q' || ((cVar1 == 't' || (cVar1 == 'z')))))))) {
                    p_Var6 = (__va_list_tag *)((long)&ap_local->gp_offset + 1);
                    precision = (int)(char)ap_local->gp_offset;
                    if ((char)p_Var6->gp_offset == 'h') {
                      precision = 0x48;
                      p_Var6 = (__va_list_tag *)((long)&ap_local->gp_offset + 2);
                    }
                    ap_local = p_Var6;
                    if ((char)ap_local->gp_offset == 'l') {
                      precision = 0x71;
                      ap_local = (__va_list_tag *)((long)&ap_local->gp_offset + 1);
                    }
                  }
                  p_Var6 = (__va_list_tag *)((long)&ap_local->gp_offset + 1);
                  cVar1 = (char)ap_local->gp_offset;
                  ap_local = p_Var6;
                  if (cVar1 != 's') break;
                  uVar2 = ap->gp_offset;
                  if (uVar2 < 0x29) {
                    local_a8 = (undefined8 *)((long)(int)uVar2 + (long)ap->reg_save_area);
                    ap->gp_offset = uVar2 + 8;
                  }
                  else {
                    local_a8 = (undefined8 *)ap->overflow_arg_area;
                    ap->overflow_arg_area = local_a8 + 1;
                  }
                  __string = (char *)*local_a8;
                  if (s._4_4_ < 0) {
                    local_b8 = 0;
                  }
                  else {
                    sVar5 = strnlen(__string,(long)s._4_4_);
                    local_b8 = (int)sVar5;
                  }
                  for (num._4_4_ = 0; num._4_4_ < (int)s - local_b8; num._4_4_ = num._4_4_ + 1) {
                    if (flags < local_1bc) {
                      buf[flags] = ' ';
                    }
                    flags = flags + 1;
                  }
                  num._4_4_ = 0;
                  while( true ) {
                    if ((s._4_4_ < 1) || (bVar7 = false, num._4_4_ < s._4_4_)) {
                      bVar7 = __string[num._4_4_] != '\0';
                    }
                    if (!bVar7) break;
                    if (flags < local_1bc) {
                      buf[flags] = __string[num._4_4_];
                    }
                    flags = flags + 1;
                    num._4_4_ = num._4_4_ + 1;
                  }
                }
                if (cVar1 != 'c') break;
                uVar2 = ap->gp_offset;
                if (uVar2 < 0x29) {
                  local_d0 = (undefined4 *)((long)(int)uVar2 + (long)ap->reg_save_area);
                  ap->gp_offset = uVar2 + 8;
                }
                else {
                  local_d0 = (undefined4 *)ap->overflow_arg_area;
                  ap->overflow_arg_area = local_d0 + 2;
                }
                if (flags < local_1bc) {
                  buf[flags] = (char)*local_d0;
                }
                flags = flags + 1;
              }
              if ((cVar1 != 'd') || (precision != 0)) break;
              uVar2 = ap->gp_offset;
              if (uVar2 < 0x29) {
                local_f8 = (int *)((long)(int)uVar2 + (long)ap->reg_save_area);
                ap->gp_offset = uVar2 + 8;
              }
              else {
                local_f8 = (int *)ap->overflow_arg_area;
                ap->overflow_arg_area = local_f8 + 2;
              }
              iVar3 = c_itoa(buf + flags,buf_size - (long)flags,(long)*local_f8,10,field_width,
                             (int)s);
              flags = iVar3 + flags;
            }
            if ((cVar1 != 'd') || (precision != 0x6c)) break;
            uVar2 = ap->gp_offset;
            if (uVar2 < 0x29) {
              local_120 = (int64_t *)((long)(int)uVar2 + (long)ap->reg_save_area);
              ap->gp_offset = uVar2 + 8;
            }
            else {
              local_120 = (int64_t *)ap->overflow_arg_area;
              ap->overflow_arg_area = local_120 + 1;
            }
            iVar3 = c_itoa(buf + flags,buf_size - (long)flags,*local_120,10,field_width,(int)s);
            flags = iVar3 + flags;
          }
          if ((cVar1 != 'd') || (precision != 0x71)) break;
          uVar2 = ap->gp_offset;
          if (uVar2 < 0x29) {
            local_148 = (int64_t *)((long)(int)uVar2 + (long)ap->reg_save_area);
            ap->gp_offset = uVar2 + 8;
          }
          else {
            local_148 = (int64_t *)ap->overflow_arg_area;
            ap->overflow_arg_area = local_148 + 1;
          }
          iVar3 = c_itoa(buf + flags,buf_size - (long)flags,*local_148,10,field_width,(int)s);
          flags = iVar3 + flags;
        }
        if (((cVar1 != 'x') && (cVar1 != 'u')) || (precision != 0)) break;
        uVar2 = ap->gp_offset;
        if (uVar2 < 0x29) {
          local_170 = (uint *)((long)(int)uVar2 + (long)ap->reg_save_area);
          ap->gp_offset = uVar2 + 8;
        }
        else {
          local_170 = (uint *)ap->overflow_arg_area;
          ap->overflow_arg_area = local_170 + 2;
        }
        iVar3 = 10;
        if (cVar1 == 'x') {
          iVar3 = 0x10;
        }
        iVar3 = c_itoa(buf + flags,buf_size - (long)flags,(ulong)*local_170,iVar3,field_width,(int)s
                      );
        flags = iVar3 + flags;
      }
      if (((cVar1 != 'x') && (cVar1 != 'u')) || (precision != 0x6c)) break;
      uVar2 = ap->gp_offset;
      if (uVar2 < 0x29) {
        local_198 = (int64_t *)((long)(int)uVar2 + (long)ap->reg_save_area);
        ap->gp_offset = uVar2 + 8;
      }
      else {
        local_198 = (int64_t *)ap->overflow_arg_area;
        ap->overflow_arg_area = local_198 + 1;
      }
      iVar3 = 10;
      if (cVar1 == 'x') {
        iVar3 = 0x10;
      }
      iVar3 = c_itoa(buf + flags,buf_size - (long)flags,*local_198,iVar3,field_width,(int)s);
      flags = iVar3 + flags;
    }
    if (cVar1 != 'p') break;
    uVar2 = ap->gp_offset;
    if (uVar2 < 0x29) {
      local_1b0 = (int64_t *)((long)(int)uVar2 + (long)ap->reg_save_area);
      ap->gp_offset = uVar2 + 8;
    }
    else {
      local_1b0 = (int64_t *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_1b0 + 1;
    }
    num_00 = *local_1b0;
    if (flags < local_1bc) {
      buf[flags] = '0';
    }
    if (flags + 1 < local_1bc) {
      buf[flags + 1] = 'x';
    }
    iVar3 = flags + 2;
    iVar4 = c_itoa(buf + iVar3,buf_size - (long)iVar3,num_00,0x10,field_width,0);
    flags = iVar4 + iVar3;
  }
  abort();
}

Assistant:

int c_vsnprintf(char *buf, size_t buf_size, const char *fmt, va_list ap) {
    int ch, i = 0, len_mod, flags, precision, field_width;

    while ((ch = *fmt++) != '\0') {
        if (ch != '%') {
            C_SNPRINTF_APPEND_CHAR(ch);
        } else {
            /*
       * Conversion specification:
       *   zero or more flags (one of: # 0 - <space> + ')
       *   an optional minimum  field  width (digits)
       *   an  optional precision (. followed by digits, or *)
       *   an optional length modifier (one of: hh h l ll L q j z t)
       *   conversion specifier (one of: d i o u x X e E f F g G a A c s p n)
       */
            flags = field_width = precision = len_mod = 0;

            /* Flags. only zero-pad flag is supported. */
            if (*fmt == '0') {
                flags |= C_SNPRINTF_FLAG_ZERO;
            }

            /* Field width */
            while (*fmt >= '0' && *fmt <= '9') {
                field_width *= 10;
                field_width += *fmt++ - '0';
            }
            /* Dynamic field width */
            if (*fmt == '*') {
                field_width = va_arg(ap, int);
                fmt++;
            }

            /* Precision */
            if (*fmt == '.') {
                fmt++;
                if (*fmt == '*') {
                    precision = va_arg(ap, int);
                    fmt++;
                } else {
                    while (*fmt >= '0' && *fmt <= '9') {
                        precision *= 10;
                        precision += *fmt++ - '0';
                    }
                }
            }

            /* Length modifier */
            switch (*fmt) {
                case 'h':
                case 'l':
                case 'L':
                case 'I':
                case 'q':
                case 'j':
                case 'z':
                case 't':
                    len_mod = *fmt++;
                    if (*fmt == 'h') {
                        len_mod = 'H';
                        fmt++;
                    }
                    if (*fmt == 'l') {
                        len_mod = 'q';
                        fmt++;
                    }
                    break;
            }

            ch = *fmt++;
            if (ch == 's') {
                const char *s = va_arg(ap, const char *); /* Always fetch parameter */
                int j;
                int pad = field_width - (precision >= 0 ? strnlen(s, precision) : 0);
                for (j = 0; j < pad; j++) {
                    C_SNPRINTF_APPEND_CHAR(' ');
                }

                /* Ignore negative and 0 precisions */
                for (j = 0; (precision <= 0 || j < precision) && s[j] != '\0'; j++) {
                    C_SNPRINTF_APPEND_CHAR(s[j]);
                }
            } else if (ch == 'c') {
                ch = va_arg(ap, int); /* Always fetch parameter */
                C_SNPRINTF_APPEND_CHAR(ch);
            } else if (ch == 'd' && len_mod == 0) {
                i += c_itoa(buf + i, buf_size - i, va_arg(ap, int), 10, flags,
                            field_width);
            } else if (ch == 'd' && len_mod == 'l') {
                i += c_itoa(buf + i, buf_size - i, va_arg(ap, long), 10, flags,
                            field_width);
            } else if (ch == 'd' && len_mod == 'q') {
                i += c_itoa(buf + i, buf_size - i, va_arg(ap, int64_t), 10, flags,
                            field_width);
            } else if ((ch == 'x' || ch == 'u') && len_mod == 0) {
                i += c_itoa(buf + i, buf_size - i, va_arg(ap, unsigned),
                            ch == 'x' ? 16 : 10, flags, field_width);
            } else if ((ch == 'x' || ch == 'u') && len_mod == 'l') {
                i += c_itoa(buf + i, buf_size - i, va_arg(ap, unsigned long),
                            ch == 'x' ? 16 : 10, flags, field_width);
            } else if (ch == 'p') {
                unsigned long num = (unsigned long) va_arg(ap, void *);
                C_SNPRINTF_APPEND_CHAR('0');
                C_SNPRINTF_APPEND_CHAR('x');
                i += c_itoa(buf + i, buf_size - i, num, 16, flags, 0);
            } else {
#ifndef NO_LIBC
                /*
         * TODO(lsm): abort is not nice in a library, remove it
         * Also, ESP8266 SDK doesn't have it
         */
                abort();
#endif
            }
        }
    }

    /* Zero-terminate the result */
    if (buf_size > 0) {
        buf[i < (int) buf_size ? i : (int) buf_size - 1] = '\0';
    }

    return i;
}